

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O0

size_t OPENSSL_sk_insert(OPENSSL_STACK *sk,void *p,size_t where)

{
  void **ppvVar1;
  void **data;
  size_t alloc_size;
  size_t new_alloc;
  size_t where_local;
  void *p_local;
  OPENSSL_STACK *sk_local;
  
  if (sk == (OPENSSL_STACK *)0x0) {
    sk_local = (OPENSSL_STACK *)0x0;
  }
  else if (sk->num < 0x7fffffff) {
    if (sk->num_alloc <= sk->num + 1) {
      alloc_size = sk->num_alloc << 1;
      data = (void **)(sk->num_alloc << 4);
      if ((alloc_size < sk->num_alloc) || ((ulong)data >> 3 != alloc_size)) {
        alloc_size = sk->num_alloc + 1;
        data = (void **)(alloc_size * 8);
      }
      if ((alloc_size < sk->num_alloc) || ((ulong)data >> 3 != alloc_size)) {
        return 0;
      }
      ppvVar1 = (void **)OPENSSL_realloc(sk->data,(size_t)data);
      if (ppvVar1 == (void **)0x0) {
        return 0;
      }
      sk->data = ppvVar1;
      sk->num_alloc = alloc_size;
    }
    if (where < sk->num) {
      OPENSSL_memmove(sk->data + where + 1,sk->data + where,(sk->num - where) * 8);
      sk->data[where] = p;
    }
    else {
      sk->data[sk->num] = p;
    }
    sk->num = sk->num + 1;
    sk->sorted = 0;
    sk_local = (OPENSSL_STACK *)sk->num;
  }
  else {
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                  ,0x8b);
    sk_local = (OPENSSL_STACK *)0x0;
  }
  return (size_t)sk_local;
}

Assistant:

size_t OPENSSL_sk_insert(OPENSSL_STACK *sk, void *p, size_t where) {
  if (sk == NULL) {
    return 0;
  }

  if (sk->num >= INT_MAX) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    return 0;
  }

  if (sk->num_alloc <= sk->num + 1) {
    // Attempt to double the size of the array.
    size_t new_alloc = sk->num_alloc << 1;
    size_t alloc_size = new_alloc * sizeof(void *);
    void **data;

    // If the doubling overflowed, try to increment.
    if (new_alloc < sk->num_alloc || alloc_size / sizeof(void *) != new_alloc) {
      new_alloc = sk->num_alloc + 1;
      alloc_size = new_alloc * sizeof(void *);
    }

    // If the increment also overflowed, fail.
    if (new_alloc < sk->num_alloc || alloc_size / sizeof(void *) != new_alloc) {
      return 0;
    }

    data = reinterpret_cast<void **>(OPENSSL_realloc(sk->data, alloc_size));
    if (data == NULL) {
      return 0;
    }

    sk->data = data;
    sk->num_alloc = new_alloc;
  }

  if (where >= sk->num) {
    sk->data[sk->num] = p;
  } else {
    OPENSSL_memmove(&sk->data[where + 1], &sk->data[where],
                    sizeof(void *) * (sk->num - where));
    sk->data[where] = p;
  }

  sk->num++;
  sk->sorted = 0;

  return sk->num;
}